

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

uint __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
::parse_header(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
               *this,iterator *it,format_specs *spec)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  uint uVar3;
  uint uVar4;
  iterator it_00;
  printf_width_handler<wchar_t> local_50;
  error_handler eh;
  
  uVar3 = 0xffffffff;
  if ((it->ptr_ != it->end_) && (wVar1 = *it->ptr_, (uint)(wVar1 + L'\xffffffd0') < 10)) {
    uVar3 = internal::
            parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::error_handler&>
                      (it,&eh);
    pwVar2 = it->ptr_;
    if ((pwVar2 == it->end_) || (*pwVar2 != L'$')) {
      if (wVar1 == L'0') {
        (spec->super_align_spec).fill_ = L'0';
      }
      if (uVar3 != 0) {
        (spec->super_align_spec).width_ = uVar3;
        return 0xffffffff;
      }
      uVar3 = 0xffffffff;
    }
    else {
      it->ptr_ = pwVar2 + 1;
    }
  }
  parse_flags(this,spec,it);
  pwVar2 = it->ptr_;
  if (pwVar2 != it->end_) {
    wVar1 = *pwVar2;
    if (wVar1 < L'0') {
      if (wVar1 != L'*') {
        return uVar3;
      }
      it_00.ptr_ = pwVar2 + 1;
      it->ptr_ = it_00.ptr_;
      it_00.end_ = it->end_;
      local_50.spec_ = spec;
      get_arg((format_arg *)&eh,this,it_00,0xffffffff);
      uVar4 = visit_format_arg<fmt::v5::internal::printf_width_handler<wchar_t>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
                        (&local_50,(format_arg *)&eh);
    }
    else {
      if (0x39 < (uint)wVar1) {
        return uVar3;
      }
      uVar4 = internal::
              parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::error_handler&>
                        (it,&eh);
    }
    (spec->super_align_spec).width_ = uVar4;
  }
  return uVar3;
}

Assistant:

unsigned basic_printf_context<OutputIt, Char, AF>::parse_header(
  iterator &it, format_specs &spec) {
  unsigned arg_index = std::numeric_limits<unsigned>::max();
  char_type c = *it;
  if (c >= '0' && c <= '9') {
    // Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag(s).
    internal::error_handler eh;
    unsigned value = parse_nonnegative_int(it, eh);
    if (*it == '$') {  // value is an argument index
      ++it;
      arg_index = value;
    } else {
      if (c == '0')
        spec.fill_ = '0';
      if (value != 0) {
        // Nonzero value means that we parsed width and don't need to
        // parse it or flags again, so return now.
        spec.width_ = value;
        return arg_index;
      }
    }
  }
  parse_flags(spec, it);
  // Parse width.
  if (*it >= '0' && *it <= '9') {
    internal::error_handler eh;
    spec.width_ = parse_nonnegative_int(it, eh);
  } else if (*it == '*') {
    ++it;
    spec.width_ = visit_format_arg(
          internal::printf_width_handler<char_type>(spec), get_arg(it));
  }
  return arg_index;
}